

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PimplImpl.h
# Opt level: O2

void __thiscall celero::Pimpl<celero::Archive::Impl>::Pimpl(Pimpl<celero::Archive::Impl> *this)

{
  _Head_base<0UL,_celero::Archive::Impl_*,_false> _Var1;
  
  _Var1._M_head_impl = (Impl *)operator_new(0x38);
  *(undefined8 *)&(_Var1._M_head_impl)->results = 0;
  *(pointer *)((long)&(_Var1._M_head_impl)->results + 8) = (pointer)0x0;
  *(pointer *)((long)&(_Var1._M_head_impl)->results + 0x10) = (pointer)0x0;
  ((_Var1._M_head_impl)->fileName)._M_dataplus =
       (pointer)((long)&(_Var1._M_head_impl)->fileName + 0x10);
  *(size_type *)((long)&(_Var1._M_head_impl)->fileName + 8) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)&(_Var1._M_head_impl)->fileName + 0x10))->_M_local_buf[0] = '\0';
  (this->_pimpl)._M_t.
  super___uniq_ptr_impl<celero::Archive::Impl,_std::default_delete<celero::Archive::Impl>_>._M_t.
  super__Tuple_impl<0UL,_celero::Archive::Impl_*,_std::default_delete<celero::Archive::Impl>_>.
  super__Head_base<0UL,_celero::Archive::Impl_*,_false>._M_head_impl = _Var1._M_head_impl;
  return;
}

Assistant:

Pimpl<T>::Pimpl() : _pimpl(new T())
	{
	}